

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generics.c++
# Opt level: O0

BrandedDecl * __thiscall
capnp::compiler::BrandedDecl::operator=(BrandedDecl *this,BrandedDecl *other)

{
  bool bVar1;
  RefOrVoid<capnp::compiler::BrandScope> object;
  BrandedDecl *local_18;
  BrandedDecl *other_local;
  BrandedDecl *this_local;
  
  local_18 = other;
  other_local = this;
  kj::OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>::
  operator=(&this->body,&other->body);
  memcpy(&this->source,&local_18->source,0x30);
  bVar1 = kj::
          OneOf<capnp::compiler::Resolver::ResolvedDecl,_capnp::compiler::Resolver::ResolvedParameter>
          ::is<capnp::compiler::Resolver::ResolvedDecl>(&this->body);
  if (bVar1) {
    object = kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator*(&local_18->brand);
    kj::addRef<capnp::compiler::BrandScope>((kj *)&stack0xffffffffffffffd8,object);
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::operator=
              (&this->brand,
               (Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&stack0xffffffffffffffd8);
    kj::Own<capnp::compiler::BrandScope,_std::nullptr_t>::~Own
              ((Own<capnp::compiler::BrandScope,_std::nullptr_t> *)&stack0xffffffffffffffd8);
  }
  return this;
}

Assistant:

BrandedDecl& BrandedDecl::operator=(BrandedDecl& other) {
  body = other.body;
  source = other.source;
  if (body.is<Resolver::ResolvedDecl>()) {
    brand = kj::addRef(*other.brand);
  }
  return *this;
}